

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O3

Result_Type
chaiscript::detail::Cast_Helper_Inner<chaiscript::dispatch::Assignable_Proxy_Function_&>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  element_type *this;
  bool bVar1;
  Result_Type pAVar2;
  bad_any_cast *this_00;
  
  this = (ob->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  if (((this->m_type_info).m_flags & 1) == 0) {
    bVar1 = Type_Info::bare_equal_type_info
                      (&this->m_type_info,
                       (type_info *)&chaiscript::dispatch::Assignable_Proxy_Function::typeinfo);
    if (bVar1) {
      pAVar2 = (Result_Type)
               throw_if_null<void>(((ob->m_data).
                                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->m_data_ptr);
      return pAVar2;
    }
  }
  this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
  exception::bad_any_cast::bad_any_cast(this_00);
  __cxa_throw(this_00,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (!ob.get_type_info().is_const() && ob.get_type_info().bare_equal_type_info(typeid(Result)))
          {
            return *(static_cast<Result *>(throw_if_null(ob.get_ptr())));
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }